

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O1

int pcap_do_addexit(pcap_t *p)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  if (did_atexit == '\0') {
    iVar1 = atexit(pcap_close_all);
    if (iVar1 == 0) {
      did_atexit = '\x01';
    }
    else {
      strncpy(p->errbuf,"atexit failed",0x100);
      p->errbuf[0xff] = '\0';
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
pcap_do_addexit(pcap_t *p)
{
	/*
	 * If we haven't already done so, arrange to have
	 * "pcap_close_all()" called when we exit.
	 */
	if (!did_atexit) {
		if (atexit(pcap_close_all) != 0) {
			/*
			 * "atexit()" failed; let our caller know.
			 */
			strlcpy(p->errbuf, "atexit failed", PCAP_ERRBUF_SIZE);
			return (0);
		}
		did_atexit = 1;
	}
	return (1);
}